

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O2

void __thiscall
cfd::core::CfdException::CfdException(CfdException *this,CfdError error_code,string *message)

{
  *(undefined ***)this = &PTR__CfdException_00784d10;
  this->error_code_ = error_code;
  ::std::__cxx11::string::string((string *)&this->message_,(string *)message);
  return;
}

Assistant:

CfdException(CfdError error_code, const std::string& message)
      : error_code_(error_code), message_(message) {}